

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::GetArrayCopy<aiFace>(aiFace **dest,ai_uint num)

{
  aiFace *__src;
  ulong *puVar1;
  aiFace *__dest;
  aiFace *paVar2;
  ulong uVar3;
  
  __src = *dest;
  if (__src != (aiFace *)0x0) {
    uVar3 = (ulong)num;
    puVar1 = (ulong *)operator_new__(uVar3 * 0x10 + 8);
    *puVar1 = uVar3;
    __dest = (aiFace *)(puVar1 + 1);
    if (num != 0) {
      paVar2 = __dest;
      do {
        paVar2->mNumIndices = 0;
        paVar2->mIndices = (uint *)0x0;
        paVar2 = paVar2 + 1;
      } while (paVar2 != __dest + uVar3);
    }
    *dest = __dest;
    memcpy(__dest,__src,uVar3 * 0x10);
    return;
  }
  return;
}

Assistant:

inline
void GetArrayCopy(Type*& dest, ai_uint num ) {
    if ( !dest ) {
        return;
    }
    Type* old = dest;

    dest = new Type[num];
    ::memcpy(dest, old, sizeof(Type) * num);
}